

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdown-tokens.cpp
# Opt level: O0

void __thiscall
markdown::token::BoldOrItalicMarker::writeAsHtml(BoldOrItalicMarker *this,ostream *out)

{
  char __c;
  size_type __n;
  bool bVar1;
  char *local_80;
  char *local_70;
  allocator<char> local_39;
  string local_38 [32];
  ostream *local_18;
  ostream *out_local;
  BoldOrItalicMarker *this_local;
  
  if ((this->mDisabled & 1U) == 0) {
    local_18 = out;
    out_local = (ostream *)this;
    if (this->mMatch == (BoldOrItalicMarker *)0x0) {
      __n = this->mSize;
      __c = this->mTokenCharacter;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_38,__n,__c,&local_39);
      std::operator<<(out,local_38);
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator(&local_39);
    }
    else {
      bVar1 = false;
      if (this->mSize != 0) {
        bVar1 = this->mSize < 4;
      }
      if (!bVar1) {
        __assert_fail("mSize>=1 && mSize<=3",
                      "/workspace/llm4binary/github/license_c_cmakelists/sevenjay[P]cpp-markdown/src/markdown-tokens.cpp"
                      ,0x2e4,
                      "virtual void markdown::token::BoldOrItalicMarker::writeAsHtml(std::ostream &) const"
                     );
      }
      if ((this->mOpenMarker & 1U) == 0) {
        if (this->mSize == 1) {
          local_80 = "</em>";
        }
        else {
          local_80 = "</em></strong>";
          if (this->mSize == 2) {
            local_80 = "</strong>";
          }
        }
        std::operator<<(out,local_80);
      }
      else {
        if (this->mSize == 1) {
          local_70 = "<em>";
        }
        else {
          local_70 = "<strong><em>";
          if (this->mSize == 2) {
            local_70 = "<strong>";
          }
        }
        std::operator<<(out,local_70);
      }
    }
  }
  return;
}

Assistant:

void BoldOrItalicMarker::writeAsHtml(std::ostream& out) const {
	if (!mDisabled) {
		if (mMatch!=0) {
			assert(mSize>=1 && mSize<=3);
			if (mOpenMarker) {
				out << (mSize==1 ? "<em>" : mSize==2 ? "<strong>" : "<strong><em>");
			} else {
				out << (mSize==1 ? "</em>" : mSize==2 ? "</strong>" : "</em></strong>");
			}
		} else out << std::string(mSize, mTokenCharacter);
	}
}